

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_ncommits(void)

{
  fdb_encryption_key *fconfig_00;
  void *pvVar1;
  fdb_doc *doc;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *doc_00;
  int iVar6;
  fdb_seqnum_t seqnum;
  fdb_kvs_handle *pfVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *pfVar12;
  ulong uVar13;
  fdb_kvs_handle *config;
  fdb_kvs_config *config_00;
  char *pcVar14;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv2;
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  fdb_iterator *pfStack_d98;
  fdb_doc *pfStack_d90;
  fdb_kvs_handle *pfStack_d88;
  timeval tStack_d80;
  char acStack_d70 [256];
  char acStack_c70 [264];
  fdb_kvs_handle *pfStack_b68;
  fdb_kvs_handle *pfStack_b60;
  fdb_kvs_handle *pfStack_b58;
  fdb_kvs_config *pfStack_b50;
  fdb_kvs_handle *pfStack_b48;
  fdb_kvs_handle *pfStack_b40;
  fdb_kvs_handle *pfStack_b30;
  fdb_custom_cmp_variable p_Stack_b28;
  fdb_kvs_handle *pfStack_b20;
  fdb_kvs_handle *pfStack_b18;
  fdb_kvs_handle *pfStack_b10;
  kvs_ops_stat *pkStack_b08;
  hbtrie *phStack_b00;
  hbtrie *phStack_af8;
  fdb_kvs_config fStack_af0;
  timeval tStack_ad8;
  undefined1 auStack_ac8 [512];
  fdb_config fStack_8c8;
  fdb_kvs_handle *pfStack_7d0;
  fdb_kvs_handle *pfStack_7c8;
  fdb_kvs_handle *pfStack_7c0;
  fdb_kvs_handle *pfStack_7b8;
  fdb_kvs_handle *pfStack_7b0;
  fdb_kvs_handle *pfStack_7a8;
  undefined1 auStack_790 [16];
  fdb_kvs_handle *pfStack_780;
  fdb_file_handle *pfStack_778;
  undefined1 auStack_770 [40];
  undefined1 auStack_748 [280];
  undefined1 auStack_630 [336];
  timeval tStack_4e0;
  fdb_kvs_handle fStack_4d0;
  fdb_kvs_handle *pfStack_2c8;
  ulong uStack_2c0;
  fdb_kvs_handle **ppfStack_2b8;
  fdb_kvs_handle *pfStack_2b0;
  fdb_kvs_handle *local_2a0;
  fdb_file_handle *local_298;
  fdb_kvs_handle *local_290;
  undefined1 local_288 [64];
  fdb_kvs_config local_248;
  fdb_config local_230;
  char local_138 [264];
  
  pfStack_2b0 = (fdb_kvs_handle *)0x116d43;
  gettimeofday((timeval *)(local_288 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_2b0 = (fdb_kvs_handle *)0x116d48;
  memleak_start();
  pfStack_2b0 = (fdb_kvs_handle *)0x116d55;
  fdb_get_default_config();
  pfStack_2b0 = (fdb_kvs_handle *)0x116d62;
  fdb_get_default_kvs_config();
  pfStack_2b0 = (fdb_kvs_handle *)0x116d6e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.compaction_threshold = '\0';
  local_230.block_reusing_threshold = 0;
  pfStack_2b0 = (fdb_kvs_handle *)0x116da5;
  fdb_open(&local_298,"./mvcc_test1",&local_230);
  pfStack_2b0 = (fdb_kvs_handle *)0x116dbc;
  fdb_kvs_open(local_298,&local_2a0,"kv1",&local_248);
  pfStack_2b0 = (fdb_kvs_handle *)0x116dce;
  fdb_kvs_open(local_298,&local_290,(char *)0x0,&local_248);
  pfVar12 = (fdb_kvs_handle *)local_288;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    iVar6 = 0;
    do {
      pfStack_2b0 = (fdb_kvs_handle *)0x116df7;
      sprintf(local_138,"key%02d%03d",doc_00);
      pfVar11 = local_2a0;
      pfStack_2b0 = (fdb_kvs_handle *)0x116e04;
      sVar3 = strlen(local_138);
      pfStack_2b0 = (fdb_kvs_handle *)0x116e17;
      fdb_set_kv(pfVar11,local_138,sVar3,(void *)0x0,0);
      pfVar11 = local_290;
      pfStack_2b0 = (fdb_kvs_handle *)0x116e24;
      sVar3 = strlen(local_138);
      pfStack_2b0 = (fdb_kvs_handle *)0x116e37;
      fdb_set_kv(pfVar11,local_138,sVar3,(void *)0x0,0);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 100);
    pfStack_2b0 = (fdb_kvs_handle *)0x116e4d;
    fdb_commit(local_298,(byte)doc_00 & 1);
    pfStack_2b0 = (fdb_kvs_handle *)0x116e5a;
    fdb_get_kvs_info(local_2a0,(fdb_kvs_info *)pfVar12);
    if (local_288._16_8_ != local_288._8_8_) {
      pfStack_2b0 = (fdb_kvs_handle *)0x116e82;
      rollback_ncommits();
    }
    uVar8 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  uVar13 = 0xb;
  seqnum = 1000;
  pfVar11 = (fdb_kvs_handle *)local_288;
  while( true ) {
    pfStack_2b0 = (fdb_kvs_handle *)0x116ea4;
    fVar2 = fdb_rollback(&local_2a0,seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pfStack_2b0 = (fdb_kvs_handle *)0x116eb9;
    fdb_get_kvs_info(local_2a0,(fdb_kvs_info *)pfVar11);
    if (local_288._16_8_ != local_288._8_8_) {
      pfStack_2b0 = (fdb_kvs_handle *)0x116ee3;
      rollback_ncommits();
    }
    uVar13 = uVar13 - 1;
    seqnum = seqnum - 100;
    if (uVar13 < 2) {
      pfStack_2b0 = (fdb_kvs_handle *)0x116eef;
      fdb_kvs_close(local_2a0);
      pfStack_2b0 = (fdb_kvs_handle *)0x116ef9;
      fdb_close(local_298);
      pfStack_2b0 = (fdb_kvs_handle *)0x116efe;
      fdb_shutdown();
      pfStack_2b0 = (fdb_kvs_handle *)0x116f03;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (rollback_ncommits()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pfStack_2b0 = (fdb_kvs_handle *)0x116f34;
      fprintf(_stderr,pcVar9,"rollback n commits");
      return;
    }
  }
  pfStack_2b0 = (fdb_kvs_handle *)transaction_test;
  rollback_ncommits();
  pfStack_7a8 = (fdb_kvs_handle *)0x116f6b;
  fStack_4d0.bub_ctx.space_used = seqnum;
  fStack_4d0.bub_ctx.handle = pfVar11;
  pfStack_2c8 = pfVar12;
  uStack_2c0 = uVar13;
  ppfStack_2b8 = &local_2a0;
  pfStack_2b0 = doc_00;
  gettimeofday(&tStack_4e0,(__timezone_ptr_t)0x0);
  pfStack_7a8 = (fdb_kvs_handle *)0x116f70;
  memleak_start();
  pfStack_7a8 = (fdb_kvs_handle *)0x116f7c;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_7a8 = (fdb_kvs_handle *)0x116f8c;
  fdb_get_default_config();
  config = (fdb_kvs_handle *)auStack_748;
  pfStack_7a8 = (fdb_kvs_handle *)0x116f99;
  fdb_get_default_kvs_config();
  fStack_4d0.config.encryption_key.bytes[4] = '\0';
  fStack_4d0.config.encryption_key.bytes[5] = '\0';
  fStack_4d0.config.encryption_key.bytes[6] = '\0';
  fStack_4d0.config.encryption_key.bytes[7] = '\0';
  fStack_4d0.config.encryption_key.bytes[8] = '\0';
  fStack_4d0.config.encryption_key.bytes[9] = '\0';
  fStack_4d0.config.encryption_key.bytes[10] = '\0';
  fStack_4d0.config.encryption_key.bytes[0xb] = '\0';
  fStack_4d0.config.encryption_key.bytes[0xc] = '\0';
  fStack_4d0.config.encryption_key.bytes[0xd] = '\x04';
  fStack_4d0.config.encryption_key.bytes[0xe] = '\0';
  fStack_4d0.config.encryption_key.bytes[0xf] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x10] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x11] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x12] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x13] = '\0';
  fStack_4d0.config._180_4_ = 1;
  fStack_4d0.config.encryption_key.bytes[0x18] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x19] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x1a] = '\0';
  fStack_4d0.config.encryption_key.bytes[0x1b] = '\0';
  fStack_4d0.config.block_reusing_threshold._7_1_ = 0;
  pfVar7 = (fdb_kvs_handle *)auStack_770;
  pfStack_7a8 = (fdb_kvs_handle *)0x116fd2;
  fdb_open((fdb_file_handle **)pfVar7,"mvcc_test1",(fdb_config *)&fStack_4d0.config.encryption_key);
  pcVar9 = auStack_790 + 8;
  pfStack_7a8 = (fdb_kvs_handle *)0x116fe5;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._0_8_,(fdb_kvs_handle **)pcVar9,(fdb_kvs_config *)config
            );
  pfStack_7a8 = (fdb_kvs_handle *)0x116ffb;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_790._8_8_,logCallbackFunc,"transaction_test");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f8f;
  fconfig_00 = &fStack_4d0.config.encryption_key;
  pfStack_7a8 = (fdb_kvs_handle *)0x117025;
  fdb_open(&pfStack_778,"mvcc_test1",(fdb_config *)fconfig_00);
  pfStack_7a8 = (fdb_kvs_handle *)0x117038;
  fdb_open((fdb_file_handle **)(auStack_770 + 0x10),"mvcc_test1",(fdb_config *)fconfig_00);
  pfStack_7a8 = (fdb_kvs_handle *)0x11704d;
  fdb_kvs_open_default(pfStack_778,&pfStack_780,(fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x11705e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._16_8_,(fdb_kvs_handle **)(auStack_770 + 8),
             (fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x11706b;
  fdb_begin_transaction(pfStack_778,'\x02');
  pfStack_7a8 = (fdb_kvs_handle *)0x117079;
  fdb_begin_transaction((fdb_file_handle *)auStack_770._16_8_,'\x02');
  lVar10 = 0;
  uVar13 = 0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117099;
    sprintf(auStack_630 + 0x50,"key%d",uVar13 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x1170b1;
    sprintf((char *)&fStack_4d0,"meta%d",uVar13 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x1170c6;
    sprintf(auStack_748 + 0x18,"body%d",uVar13 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x1170d9;
    sVar3 = strlen(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x1170ec;
    sVar4 = strlen((char *)&fStack_4d0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1170f9;
    sVar5 = strlen(auStack_748 + 0x18);
    pfStack_7a8 = (fdb_kvs_handle *)0x11711b;
    fdb_doc_create((fdb_doc **)(auStack_630 + lVar10),auStack_630 + 0x50,sVar3,&fStack_4d0,sVar4,
                   auStack_748 + 0x18,sVar5);
    pfStack_7a8 = (fdb_kvs_handle *)0x11712d;
    fdb_set(pfStack_780,*(fdb_doc **)(auStack_630 + uVar13 * 8));
    uVar13 = uVar13 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar13 != 5);
  uVar13 = 5;
  pfVar12 = (fdb_kvs_handle *)0x28;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117164;
    sprintf(auStack_630 + 0x50,"key%d",uVar13 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x11717c;
    sprintf((char *)&fStack_4d0,"meta%d",uVar13 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x117191;
    sprintf(auStack_748 + 0x18,"body%d",uVar13 & 0xffffffff);
    pfVar11 = (fdb_kvs_handle *)(auStack_630 + (long)pfVar12);
    pfStack_7a8 = (fdb_kvs_handle *)0x1171a4;
    sVar3 = strlen(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x1171b7;
    sVar4 = strlen((char *)&fStack_4d0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1171c4;
    sVar5 = strlen(auStack_748 + 0x18);
    pfStack_7a8 = (fdb_kvs_handle *)0x1171e6;
    fdb_doc_create((fdb_doc **)pfVar11,auStack_630 + 0x50,sVar3,&fStack_4d0,sVar4,auStack_748 + 0x18
                   ,sVar5);
    pfStack_7a8 = (fdb_kvs_handle *)0x1171f8;
    fdb_set((fdb_kvs_handle *)auStack_770._8_8_,*(fdb_doc **)(auStack_630 + uVar13 * 8));
    uVar13 = uVar13 + 1;
    pfVar12 = (fdb_kvs_handle *)((long)pfVar12 + 8);
  } while (uVar13 != 10);
  pcVar9 = "key%d";
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar7 = (fdb_kvs_handle *)auStack_790;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x11722e;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x117236;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117254;
    fdb_doc_create((fdb_doc **)pfVar7,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117263;
    fVar2 = fdb_get(pfStack_780,(fdb_doc *)auStack_790._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f71;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f76;
    pfStack_7a8 = (fdb_kvs_handle *)0x117283;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar8 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x1172a6;
  fdb_open((fdb_file_handle **)(auStack_770 + 0x18),"mvcc_test1",
           (fdb_config *)&fStack_4d0.config.encryption_key);
  pfStack_7a8 = (fdb_kvs_handle *)0x1172b8;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._24_8_,(fdb_kvs_handle **)(auStack_770 + 0x20),
             (fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x1172c5;
  fdb_begin_transaction((fdb_file_handle *)auStack_770._24_8_,'\x03');
  pcVar9 = auStack_630 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1172ea;
    sprintf(pcVar9,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x1172f2;
    sVar3 = strlen(pcVar9);
    pfStack_7a8 = (fdb_kvs_handle *)0x117310;
    fdb_doc_create((fdb_doc **)auStack_790,pcVar9,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x11731f;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_770._32_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_7a8 = (fdb_kvs_handle *)0x117ed9;
      transaction_test();
      goto LAB_00117ed9;
    }
    pfStack_7a8 = (fdb_kvs_handle *)0x117331;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar8 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x117344;
  fdb_end_transaction((fdb_file_handle *)auStack_770._24_8_,'\0');
  pfStack_7a8 = (fdb_kvs_handle *)0x11734e;
  fdb_close((fdb_file_handle *)auStack_770._24_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x11735a;
  fdb_end_transaction(pfStack_778,'\0');
  pcVar9 = "key%d";
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar7 = (fdb_kvs_handle *)auStack_790;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x11737f;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x117387;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x1173a5;
    fdb_doc_create((fdb_doc **)pfVar7,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1173b4;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f7b;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f80;
    pfStack_7a8 = (fdb_kvs_handle *)0x1173d4;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar8 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar7 = (fdb_kvs_handle *)auStack_790;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117400;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x117408;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117426;
    fdb_doc_create((fdb_doc **)pfVar7,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117435;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_770._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117ed9;
    pfStack_7a8 = (fdb_kvs_handle *)0x117447;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar8 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x117458;
  fdb_abort_transaction((fdb_file_handle *)auStack_770._16_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x117465;
  fdb_close((fdb_file_handle *)auStack_770._0_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x11747c;
  fdb_open((fdb_file_handle **)auStack_770,"mvcc_test1",
           (fdb_config *)&fStack_4d0.config.encryption_key);
  pcVar9 = auStack_790 + 8;
  pfStack_7a8 = (fdb_kvs_handle *)0x117491;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._0_8_,(fdb_kvs_handle **)pcVar9,
             (fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x1174a7;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_790._8_8_,logCallbackFunc,"transaction_test");
  pcVar14 = (char *)pfVar11;
  handle = pfVar12;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f94;
  pcVar9 = "key%d";
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar7 = (fdb_kvs_handle *)auStack_790;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1174d4;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x1174dc;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x1174fa;
    fdb_doc_create((fdb_doc **)pfVar7,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117509;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f85;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117f8a;
    pfStack_7a8 = (fdb_kvs_handle *)0x117529;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar8 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  lVar10 = 0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117544;
    fdb_set((fdb_kvs_handle *)auStack_790._8_8_,*(fdb_doc **)(auStack_630 + lVar10 * 8 + 0x28));
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  pfStack_7a8 = (fdb_kvs_handle *)0x117559;
  fdb_commit((fdb_file_handle *)auStack_770._0_8_,'\0');
  pcVar9 = auStack_630 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x11757e;
    sprintf(pcVar9,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x117586;
    sVar3 = strlen(pcVar9);
    pfStack_7a8 = (fdb_kvs_handle *)0x1175a4;
    fdb_doc_create((fdb_doc **)auStack_790,pcVar9,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1175b3;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117ede;
    pfStack_7a8 = (fdb_kvs_handle *)0x1175c5;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar8 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x1175db;
  fdb_begin_transaction(pfStack_778,'\x02');
  pfStack_7a8 = (fdb_kvs_handle *)0x1175ea;
  fdb_begin_transaction((fdb_file_handle *)auStack_770._16_8_,'\x02');
  uVar13 = 0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117609;
    sprintf(auStack_630 + 0x50,"key%d",uVar13);
    doc_00 = &fStack_4d0;
    pfStack_7a8 = (fdb_kvs_handle *)0x117625;
    sprintf((char *)doc_00,"meta%d",uVar13);
    pcVar14 = auStack_748 + 0x18;
    pfStack_7a8 = (fdb_kvs_handle *)0x11763e;
    sprintf(pcVar14,"body%d_txn1",uVar13);
    pfStack_7a8 = (fdb_kvs_handle *)0x117646;
    sVar3 = strlen(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x117651;
    sVar4 = strlen((char *)doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x11765c;
    sVar5 = strlen(pcVar14);
    pcVar9 = auStack_630 + 0x50;
    pfStack_7a8 = (fdb_kvs_handle *)0x117681;
    fdb_doc_create((fdb_doc **)auStack_790,pcVar9,sVar3,doc_00,sVar4,pcVar14,sVar5);
    pfStack_7a8 = (fdb_kvs_handle *)0x117690;
    fdb_set(pfStack_780,(fdb_doc *)auStack_790._0_8_);
    pfStack_7a8 = (fdb_kvs_handle *)0x11769a;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    pfStack_7a8 = (fdb_kvs_handle *)0x1176ae;
    sprintf(pcVar14,"body%d_txn2",uVar13);
    pfStack_7a8 = (fdb_kvs_handle *)0x1176b6;
    sVar3 = strlen(pcVar9);
    pfStack_7a8 = (fdb_kvs_handle *)0x1176c1;
    sVar4 = strlen((char *)doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x1176cc;
    sVar5 = strlen(pcVar14);
    pfStack_7a8 = (fdb_kvs_handle *)0x1176e9;
    fdb_doc_create((fdb_doc **)auStack_790,pcVar9,sVar3,doc_00,sVar4,pcVar14,sVar5);
    pfStack_7a8 = (fdb_kvs_handle *)0x1176f8;
    fdb_set((fdb_kvs_handle *)auStack_770._8_8_,(fdb_doc *)auStack_790._0_8_);
    pfStack_7a8 = (fdb_kvs_handle *)0x117702;
    fdb_doc_free((fdb_doc *)auStack_790._0_8_);
    uVar8 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar8;
  } while (uVar8 != 10);
  pfVar12 = (fdb_kvs_handle *)auStack_790;
  handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
  pcVar9 = (char *)0x0;
  do {
    config = (fdb_kvs_handle *)(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x117736;
    sprintf((char *)config,"key%d",(ulong)pcVar9 & 0xffffffff);
    pfStack_7a8 = (fdb_kvs_handle *)0x11773e;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x11775c;
    fdb_doc_create((fdb_doc **)pfVar12,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x11776b;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    pfVar11 = (fdb_kvs_handle *)auStack_790._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117eee;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfVar7 = *(fdb_kvs_handle **)(*(long *)(auStack_630 + (long)pcVar9 * 8) + 0x40);
    pfStack_7a8 = (fdb_kvs_handle *)0x11779f;
    iVar6 = bcmp(doc_00,pfVar7,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    config = handle;
    if (iVar6 != 0) goto LAB_00117ee3;
    pfStack_7a8 = (fdb_kvs_handle *)0x1177af;
    fdb_doc_free((fdb_doc *)pfVar11);
    pcVar14 = auStack_630 + 0x50;
    pfStack_7a8 = (fdb_kvs_handle *)0x1177bf;
    sVar3 = strlen(pcVar14);
    pfStack_7a8 = (fdb_kvs_handle *)0x1177e0;
    fdb_doc_create((fdb_doc **)pfVar12,pcVar14,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1177ef;
    fVar2 = fdb_get(pfStack_780,(fdb_doc *)auStack_790._0_8_);
    pfVar11 = pfVar12;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f00;
    pfStack_7a8 = (fdb_kvs_handle *)0x11780d;
    sprintf((char *)handle,"body%d_txn1",(ulong)pcVar9 & 0xffffffff);
    pcVar14 = (char *)auStack_790._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x117827;
    iVar6 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117ef3;
    pfStack_7a8 = (fdb_kvs_handle *)0x117837;
    fdb_doc_free((fdb_doc *)pcVar14);
    config = (fdb_kvs_handle *)(auStack_630 + 0x50);
    pfStack_7a8 = (fdb_kvs_handle *)0x117847;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117865;
    fdb_doc_create((fdb_doc **)pfVar12,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117874;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_770._8_8_,(fdb_doc *)auStack_790._0_8_);
    pfVar7 = pfVar12;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f12;
    pfStack_7a8 = (fdb_kvs_handle *)0x11788f;
    sprintf((char *)handle,"body%d_txn2",(ulong)pcVar9 & 0xffffffff);
    pcVar14 = (char *)auStack_790._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x1178a9;
    iVar6 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f05;
    pfStack_7a8 = (fdb_kvs_handle *)0x1178b9;
    fdb_doc_free((fdb_doc *)pcVar14);
    pcVar9 = &(((fdb_kvs_handle *)pcVar9)->kvs_config).field_0x1;
  } while (pcVar9 != (undefined1 *)0xa);
  pfStack_7a8 = (fdb_kvs_handle *)0x1178d2;
  fdb_end_transaction((fdb_file_handle *)auStack_770._16_8_,'\0');
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar7 = (fdb_kvs_handle *)auStack_790;
  handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
  pcVar9 = (char *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x1178f9;
    sprintf((char *)config,"key%d",pcVar9);
    pfStack_7a8 = (fdb_kvs_handle *)0x117901;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x11791f;
    fdb_doc_create((fdb_doc **)pfVar7,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x11792e;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f24;
    pfStack_7a8 = (fdb_kvs_handle *)0x117949;
    sprintf((char *)handle,"body%d_txn2",pcVar9);
    pcVar14 = (char *)auStack_790._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x117963;
    iVar6 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f17;
    pfStack_7a8 = (fdb_kvs_handle *)0x117973;
    fdb_doc_free((fdb_doc *)pcVar14);
    pfStack_7a8 = (fdb_kvs_handle *)0x11797b;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117999;
    fdb_doc_create((fdb_doc **)pfVar7,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x1179a8;
    fVar2 = fdb_get(pfStack_780,(fdb_doc *)auStack_790._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f36;
    pfStack_7a8 = (fdb_kvs_handle *)0x1179c3;
    sprintf((char *)handle,"body%d_txn1",pcVar9);
    pcVar14 = (char *)auStack_790._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x1179dd;
    iVar6 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f29;
    pfStack_7a8 = (fdb_kvs_handle *)0x1179ed;
    fdb_doc_free((fdb_doc *)pcVar14);
    uVar8 = (int)pcVar9 + 1;
    pcVar9 = (char *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x117a04;
  fdb_end_transaction(pfStack_778,'\0');
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pcVar14 = "body%d_txn1";
  handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117a2d;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_7a8 = (fdb_kvs_handle *)0x117a35;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117a55;
    fdb_doc_create((fdb_doc **)auStack_790,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117a64;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f48;
    pfStack_7a8 = (fdb_kvs_handle *)0x117a7b;
    sprintf((char *)handle,"body%d_txn1",doc_00);
    pcVar9 = (char *)auStack_790._0_8_;
    pfVar7 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x117a93;
    iVar6 = bcmp(pfVar7,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f3b;
    pfStack_7a8 = (fdb_kvs_handle *)0x117aa3;
    fdb_doc_free((fdb_doc *)pcVar9);
    uVar8 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x117abd;
  fdb_begin_transaction(pfStack_778,'\x02');
  pfVar12 = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfStack_7a8 = (fdb_kvs_handle *)0x117adb;
  sprintf((char *)pfVar12,"key%d",5);
  pfVar7 = &fStack_4d0;
  pfStack_7a8 = (fdb_kvs_handle *)0x117af9;
  sprintf((char *)pfVar7,"meta%d",5);
  pcVar14 = auStack_748 + 0x18;
  pfStack_7a8 = (fdb_kvs_handle *)0x117b14;
  sprintf(pcVar14,"body%d_before_compaction",5);
  pfStack_7a8 = (fdb_kvs_handle *)0x117b1c;
  handle = (fdb_kvs_handle *)strlen((char *)pfVar12);
  pfStack_7a8 = (fdb_kvs_handle *)0x117b27;
  doc_00 = (fdb_kvs_handle *)strlen((char *)pfVar7);
  pfStack_7a8 = (fdb_kvs_handle *)0x117b32;
  sVar3 = strlen(pcVar14);
  config = (fdb_kvs_handle *)auStack_790;
  pfStack_7a8 = (fdb_kvs_handle *)0x117b52;
  fdb_doc_create((fdb_doc **)config,pfVar12,(size_t)handle,pfVar7,(size_t)doc_00,pcVar14,sVar3);
  pfStack_7a8 = (fdb_kvs_handle *)0x117b5f;
  fdb_set(pfStack_780,(fdb_doc *)auStack_790._0_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x117b67;
  fdb_doc_free((fdb_doc *)auStack_790._0_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x117b78;
  fdb_compact((fdb_file_handle *)auStack_770._0_8_,"mvcc_test2");
  pfStack_7a8 = (fdb_kvs_handle *)0x117b80;
  sVar3 = strlen((char *)pfVar12);
  pfStack_7a8 = (fdb_kvs_handle *)0x117b9e;
  fdb_doc_create((fdb_doc **)config,pfVar12,sVar3,(void *)0x0,0,(void *)0x0,0);
  pfStack_7a8 = (fdb_kvs_handle *)0x117bab;
  fVar2 = fdb_get(pfStack_780,(fdb_doc *)auStack_790._0_8_);
  pcVar9 = (char *)auStack_790._0_8_;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f99;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
  pfStack_7a8 = (fdb_kvs_handle *)0x117bcd;
  iVar6 = bcmp(config,auStack_748 + 0x18,
               (size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
  if (iVar6 != 0) goto LAB_00117f9e;
  pfStack_7a8 = (fdb_kvs_handle *)0x117bdd;
  fdb_doc_free((fdb_doc *)pcVar9);
  pcVar9 = auStack_630 + 0x50;
  pfStack_7a8 = (fdb_kvs_handle *)0x117bed;
  sVar3 = strlen(pcVar9);
  config = (fdb_kvs_handle *)auStack_790;
  pfStack_7a8 = (fdb_kvs_handle *)0x117c10;
  fdb_doc_create((fdb_doc **)config,pcVar9,sVar3,(void *)0x0,0,(void *)0x0,0);
  pfStack_7a8 = (fdb_kvs_handle *)0x117c1d;
  fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117fab;
  pfVar7 = (fdb_kvs_handle *)(auStack_748 + 0x18);
  pfStack_7a8 = (fdb_kvs_handle *)0x117c40;
  sprintf((char *)pfVar7,"body%d_txn1",5);
  pcVar9 = (char *)auStack_790._0_8_;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->seqtree;
  pfStack_7a8 = (fdb_kvs_handle *)0x117c58;
  iVar6 = bcmp(config,pfVar7,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
  if (iVar6 != 0) goto LAB_00117fb0;
  pfStack_7a8 = (fdb_kvs_handle *)0x117c68;
  fdb_doc_free((fdb_doc *)pcVar9);
  pfStack_7a8 = (fdb_kvs_handle *)0x117c74;
  fdb_end_transaction(pfStack_778,'\0');
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pfVar7 = (fdb_kvs_handle *)auStack_790;
  handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
  pcVar14 = (char *)0x0;
  do {
    pfStack_7a8 = (fdb_kvs_handle *)0x117c9d;
    sprintf((char *)config,"key%d",pcVar14);
    pfStack_7a8 = (fdb_kvs_handle *)0x117ca5;
    sVar3 = strlen((char *)config);
    pfStack_7a8 = (fdb_kvs_handle *)0x117cc3;
    fdb_doc_create((fdb_doc **)pfVar7,config,sVar3,(void *)0x0,0,(void *)0x0,0);
    pfStack_7a8 = (fdb_kvs_handle *)0x117cd2;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117f5a;
    if ((int)pcVar14 == 5) {
      pcVar9 = "body%d_before_compaction";
      pfVar12 = (fdb_kvs_handle *)0x5;
    }
    else {
      pcVar9 = "body%d_txn1";
      pfVar12 = (fdb_kvs_handle *)pcVar14;
    }
    pfStack_7a8 = (fdb_kvs_handle *)0x117d02;
    sprintf((char *)handle,pcVar9,pfVar12);
    doc_00 = (fdb_kvs_handle *)auStack_790._0_8_;
    pcVar9 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))->
                     seqtree;
    pfStack_7a8 = (fdb_kvs_handle *)0x117d1a;
    iVar6 = bcmp(pcVar9,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
    if (iVar6 != 0) goto LAB_00117f4d;
    pfStack_7a8 = (fdb_kvs_handle *)0x117d2a;
    fdb_doc_free((fdb_doc *)doc_00);
    uVar8 = (int)pcVar14 + 1;
    pcVar14 = (char *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_7a8 = (fdb_kvs_handle *)0x117d44;
  fdb_close((fdb_file_handle *)auStack_770._0_8_);
  pfStack_7a8 = (fdb_kvs_handle *)0x117d5b;
  fdb_open((fdb_file_handle **)auStack_770,"mvcc_test2",
           (fdb_config *)&fStack_4d0.config.encryption_key);
  pcVar9 = auStack_790 + 8;
  pfStack_7a8 = (fdb_kvs_handle *)0x117d70;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_770._0_8_,(fdb_kvs_handle **)pcVar9,
             (fdb_kvs_config *)auStack_748);
  pfStack_7a8 = (fdb_kvs_handle *)0x117d86;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_790._8_8_,logCallbackFunc,"transaction_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    config = (fdb_kvs_handle *)(auStack_630 + 0x50);
    pfVar7 = (fdb_kvs_handle *)auStack_790;
    handle = (fdb_kvs_handle *)(auStack_748 + 0x18);
    pcVar14 = (char *)0x0;
    while( true ) {
      pfStack_7a8 = (fdb_kvs_handle *)0x117db7;
      sprintf((char *)config,"key%d",pcVar14);
      pfStack_7a8 = (fdb_kvs_handle *)0x117dbf;
      sVar3 = strlen((char *)config);
      pfStack_7a8 = (fdb_kvs_handle *)0x117ddd;
      fdb_doc_create((fdb_doc **)pfVar7,config,sVar3,(void *)0x0,0,(void *)0x0,0);
      pfStack_7a8 = (fdb_kvs_handle *)0x117dec;
      fVar2 = fdb_get((fdb_kvs_handle *)auStack_790._8_8_,(fdb_doc *)auStack_790._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      if ((int)pcVar14 == 5) {
        pcVar9 = "body%d_before_compaction";
        pfVar12 = (fdb_kvs_handle *)0x5;
      }
      else {
        pcVar9 = "body%d_txn1";
        pfVar12 = (fdb_kvs_handle *)pcVar14;
      }
      pfStack_7a8 = (fdb_kvs_handle *)0x117e1c;
      sprintf((char *)handle,pcVar9,pfVar12);
      doc_00 = (fdb_kvs_handle *)auStack_790._0_8_;
      pcVar9 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_790._0_8_ + 0x40))
                       ->seqtree;
      pfStack_7a8 = (fdb_kvs_handle *)0x117e34;
      iVar6 = bcmp(pcVar9,handle,(size_t)((fdb_kvs_config *)auStack_790._0_8_)->custom_cmp_param);
      if (iVar6 != 0) goto LAB_00117f5f;
      pfStack_7a8 = (fdb_kvs_handle *)0x117e44;
      fdb_doc_free((fdb_doc *)doc_00);
      uVar8 = (int)pcVar14 + 1;
      pcVar14 = (char *)(ulong)uVar8;
      if (uVar8 == 10) {
        pfStack_7a8 = (fdb_kvs_handle *)0x117e5b;
        fdb_close((fdb_file_handle *)auStack_770._0_8_);
        pfStack_7a8 = (fdb_kvs_handle *)0x117e65;
        fdb_close(pfStack_778);
        pfStack_7a8 = (fdb_kvs_handle *)0x117e6f;
        fdb_close((fdb_file_handle *)auStack_770._16_8_);
        lVar10 = 0;
        do {
          pfStack_7a8 = (fdb_kvs_handle *)0x117e7e;
          fdb_doc_free(*(fdb_doc **)(auStack_630 + lVar10 * 8));
          lVar10 = lVar10 + 1;
        } while (lVar10 != 10);
        pfStack_7a8 = (fdb_kvs_handle *)0x117e8c;
        fdb_shutdown();
        pfStack_7a8 = (fdb_kvs_handle *)0x117e91;
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (transaction_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        pfStack_7a8 = (fdb_kvs_handle *)0x117ec2;
        fprintf(_stderr,pcVar9,"transaction test");
        return;
      }
    }
    goto LAB_00117f6c;
  }
  goto LAB_00117fbd;
LAB_001185e9:
  pfStack_b40 = (fdb_kvs_handle *)0x1185f6;
  transaction_simple_api_test();
  pfVar11 = pfVar12;
LAB_001185f6:
  pfStack_b40 = (fdb_kvs_handle *)0x1185fb;
  transaction_simple_api_test();
LAB_001185fb:
  pfStack_b40 = (fdb_kvs_handle *)0x118608;
  transaction_simple_api_test();
  pfVar12 = pfVar11;
LAB_00118608:
  pfStack_b40 = (fdb_kvs_handle *)0x11860d;
  transaction_simple_api_test();
LAB_0011860d:
  pfStack_b40 = (fdb_kvs_handle *)0x11861a;
  transaction_simple_api_test();
  pfVar7 = pfVar12;
LAB_0011861a:
  pfStack_b40 = (fdb_kvs_handle *)0x11861f;
  transaction_simple_api_test();
LAB_0011861f:
  pfStack_b40 = (fdb_kvs_handle *)0x11862c;
  transaction_simple_api_test();
  pfVar12 = pfVar7;
LAB_0011862c:
  pfVar7 = pfVar12;
  pfStack_b40 = (fdb_kvs_handle *)0x118631;
  transaction_simple_api_test();
LAB_00118631:
  pfStack_b40 = (fdb_kvs_handle *)0x118636;
  transaction_simple_api_test();
LAB_00118636:
  pfVar11 = pfVar7;
  pfStack_b40 = (fdb_kvs_handle *)0x11863b;
  transaction_simple_api_test();
LAB_0011863b:
  pfStack_b40 = (fdb_kvs_handle *)0x118648;
  transaction_simple_api_test();
LAB_00118648:
  pfVar7 = (fdb_kvs_handle *)auStack_ac8;
  pfStack_b40 = (fdb_kvs_handle *)0x118655;
  transaction_simple_api_test();
  pfVar12 = (fdb_kvs_handle *)pcVar14;
  goto LAB_00118655;
LAB_00117ed9:
  pfStack_7a8 = (fdb_kvs_handle *)0x117ede;
  transaction_test();
LAB_00117ede:
  pfVar7 = (fdb_kvs_handle *)auStack_790;
  config = (fdb_kvs_handle *)(auStack_630 + 0x50);
  pcVar9 = "key%d";
  pfStack_7a8 = (fdb_kvs_handle *)0x117ee3;
  transaction_test();
LAB_00117ee3:
  pfStack_7a8 = (fdb_kvs_handle *)0x117eee;
  transaction_test();
  pcVar14 = (char *)pfVar11;
  handle = pfVar12;
  pfVar12 = pfVar7;
LAB_00117eee:
  pfStack_7a8 = (fdb_kvs_handle *)0x117ef3;
  transaction_test();
LAB_00117ef3:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f00;
  transaction_test();
  pfVar11 = handle;
LAB_00117f00:
  handle = pfVar11;
  pfStack_7a8 = (fdb_kvs_handle *)0x117f05;
  transaction_test();
  pfVar7 = pfVar12;
LAB_00117f05:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f12;
  transaction_test();
LAB_00117f12:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f17;
  transaction_test();
LAB_00117f17:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f24;
  transaction_test();
LAB_00117f24:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f29;
  transaction_test();
LAB_00117f29:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f36;
  transaction_test();
LAB_00117f36:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f3b;
  transaction_test();
LAB_00117f3b:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f48;
  transaction_test();
LAB_00117f48:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f4d;
  transaction_test();
LAB_00117f4d:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f5a;
  transaction_test();
LAB_00117f5a:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f5f;
  transaction_test();
LAB_00117f5f:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f6c;
  transaction_test();
LAB_00117f6c:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f71;
  transaction_test();
  pfVar11 = (fdb_kvs_handle *)pcVar14;
  pfVar12 = handle;
LAB_00117f71:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f76;
  transaction_test();
LAB_00117f76:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f7b;
  transaction_test();
LAB_00117f7b:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f80;
  transaction_test();
LAB_00117f80:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f85;
  transaction_test();
LAB_00117f85:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f8a;
  transaction_test();
LAB_00117f8a:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f8f;
  transaction_test();
LAB_00117f8f:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f94;
  transaction_test();
  pcVar14 = (char *)pfVar11;
  handle = pfVar12;
LAB_00117f94:
  pfStack_7a8 = (fdb_kvs_handle *)0x117f99;
  transaction_test();
  pfVar12 = (fdb_kvs_handle *)pcVar9;
LAB_00117f99:
  pcVar9 = (char *)pfVar12;
  pfStack_7a8 = (fdb_kvs_handle *)0x117f9e;
  transaction_test();
LAB_00117f9e:
  pfStack_7a8 = (fdb_kvs_handle *)0x117fab;
  transaction_test();
LAB_00117fab:
  pfStack_7a8 = (fdb_kvs_handle *)0x117fb0;
  transaction_test();
LAB_00117fb0:
  pfStack_7a8 = (fdb_kvs_handle *)0x117fbd;
  transaction_test();
LAB_00117fbd:
  pfStack_7a8 = (fdb_kvs_handle *)transaction_simple_api_test;
  transaction_test();
  pfStack_b40 = (fdb_kvs_handle *)0x117fdf;
  pfStack_7d0 = (fdb_kvs_handle *)pcVar9;
  pfStack_7c8 = (fdb_kvs_handle *)pcVar14;
  pfStack_7c0 = handle;
  pfStack_7b8 = config;
  pfStack_7b0 = pfVar7;
  pfStack_7a8 = doc_00;
  gettimeofday(&tStack_ad8,(__timezone_ptr_t)0x0);
  pfStack_b40 = (fdb_kvs_handle *)0x117fe4;
  memleak_start();
  pfStack_b40 = (fdb_kvs_handle *)0x117ff0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b40 = (fdb_kvs_handle *)0x118000;
  fdb_get_default_config();
  config_00 = &fStack_af0;
  pfStack_b40 = (fdb_kvs_handle *)0x11800d;
  fdb_get_default_kvs_config();
  fStack_8c8.buffercache_size = 0;
  fStack_8c8.wal_threshold = 0x400;
  fStack_8c8.flags = 1;
  fStack_8c8.purging_interval = 0;
  fStack_8c8.compaction_threshold = '\0';
  pfVar12 = (fdb_kvs_handle *)&phStack_af8;
  pfStack_b40 = (fdb_kvs_handle *)0x118046;
  fdb_open((fdb_file_handle **)pfVar12,"./mvcc_test1",&fStack_8c8);
  pfVar11 = (fdb_kvs_handle *)&pfStack_b20;
  pfStack_b40 = (fdb_kvs_handle *)0x118059;
  fdb_kvs_open_default((fdb_file_handle *)phStack_af8,(fdb_kvs_handle **)pfVar11,config_00);
  pfStack_b40 = (fdb_kvs_handle *)0x11806f;
  pfVar7 = pfStack_b20;
  fVar2 = fdb_set_log_callback(pfStack_b20,logCallbackFunc,"transaction_simple_api_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar9 = auStack_ac8 + 0x100;
    pcVar14 = "body%d";
    doc_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x1180a0;
      sprintf(pcVar9,"key%d",doc_00);
      pfStack_b40 = (fdb_kvs_handle *)0x1180af;
      sprintf(auStack_ac8,"body%d",doc_00);
      handle = pfStack_b20;
      pfStack_b40 = (fdb_kvs_handle *)0x1180bc;
      pfVar12 = (fdb_kvs_handle *)strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x1180c7;
      sVar3 = strlen(auStack_ac8);
      pfStack_b40 = (fdb_kvs_handle *)0x1180db;
      fVar2 = fdb_set_kv(handle,pcVar9,(size_t)pfVar12,auStack_ac8,sVar3);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_b40 = (fdb_kvs_handle *)0x1185e9;
        transaction_simple_api_test();
        goto LAB_001185e9;
      }
      uVar8 = (int)doc_00 + 1;
      doc_00 = (fdb_kvs_handle *)(ulong)uVar8;
    } while (uVar8 != 10);
    pfStack_b40 = (fdb_kvs_handle *)0x1180f6;
    fdb_commit((fdb_file_handle *)phStack_af8,'\0');
    pfStack_b40 = (fdb_kvs_handle *)0x118118;
    fdb_open((fdb_file_handle **)&phStack_b00,"./mvcc_test1",&fStack_8c8);
    pfStack_b40 = (fdb_kvs_handle *)0x11812b;
    fdb_open((fdb_file_handle **)&pkStack_b08,"./mvcc_test1",&fStack_8c8);
    pfStack_b40 = (fdb_kvs_handle *)0x118140;
    fdb_kvs_open_default((fdb_file_handle *)phStack_b00,&pfStack_b10,&fStack_af0);
    pfStack_b40 = (fdb_kvs_handle *)0x118151;
    fdb_kvs_open_default((fdb_file_handle *)pkStack_b08,&pfStack_b18,&fStack_af0);
    pfStack_b40 = (fdb_kvs_handle *)0x11815e;
    fdb_begin_transaction((fdb_file_handle *)phStack_b00,'\x02');
    pfStack_b40 = (fdb_kvs_handle *)0x11816c;
    fdb_begin_transaction((fdb_file_handle *)pkStack_b08,'\x02');
    pcVar9 = auStack_ac8 + 0x100;
    uVar8 = 0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x118191;
      sprintf(pcVar9,"key%d",(ulong)uVar8);
      pfStack_b40 = (fdb_kvs_handle *)0x1181a4;
      sprintf(auStack_ac8,"body%d_txn1",(ulong)uVar8);
      pfVar12 = pfStack_b10;
      pfStack_b40 = (fdb_kvs_handle *)0x1181b1;
      sVar3 = strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x1181bc;
      sVar4 = strlen(auStack_ac8);
      pfStack_b40 = (fdb_kvs_handle *)0x1181d0;
      fdb_set_kv(pfVar12,pcVar9,sVar3,auStack_ac8,sVar4);
      pfStack_b40 = (fdb_kvs_handle *)0x1181df;
      sprintf(pcVar9,"key%d",(ulong)uVar8);
      pfStack_b40 = (fdb_kvs_handle *)0x1181f2;
      sprintf(auStack_ac8,"body%d_txn2",(ulong)uVar8);
      pfVar12 = pfStack_b18;
      pfStack_b40 = (fdb_kvs_handle *)0x1181ff;
      sVar3 = strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x11820a;
      sVar4 = strlen(auStack_ac8);
      pfStack_b40 = (fdb_kvs_handle *)0x11821e;
      fdb_set_kv(pfVar12,pcVar9,sVar3,auStack_ac8,sVar4);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 10);
    pcVar9 = auStack_ac8 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_b30;
    doc_00 = (fdb_kvs_handle *)&p_Stack_b28;
    pcVar14 = (char *)0x0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x118257;
      sprintf(pcVar9,"key%d",pcVar14);
      pfStack_b40 = (fdb_kvs_handle *)0x11826b;
      sprintf(auStack_ac8,"body%d",pcVar14);
      pfVar11 = pfStack_b20;
      pfStack_b40 = (fdb_kvs_handle *)0x118278;
      sVar3 = strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x11828c;
      fVar2 = fdb_get_kv(pfVar11,pcVar9,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar12 = pfStack_b30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001185f6;
      pfStack_b40 = (fdb_kvs_handle *)0x1182a9;
      iVar6 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar6 != 0) goto LAB_001185e9;
      pfStack_b40 = (fdb_kvs_handle *)0x1182b9;
      fdb_free_block(pfVar12);
      pfStack_b40 = (fdb_kvs_handle *)0x1182cd;
      sprintf(pcVar9,"key%d",pcVar14);
      pfStack_b40 = (fdb_kvs_handle *)0x1182e1;
      sprintf(auStack_ac8,"body%d_txn1",pcVar14);
      pfVar12 = pfStack_b10;
      pfStack_b40 = (fdb_kvs_handle *)0x1182ee;
      sVar3 = strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x118302;
      fVar2 = fdb_get_kv(pfVar12,pcVar9,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar11 = pfStack_b30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118608;
      pfStack_b40 = (fdb_kvs_handle *)0x11831f;
      iVar6 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar6 != 0) goto LAB_001185fb;
      pfStack_b40 = (fdb_kvs_handle *)0x11832f;
      fdb_free_block(pfVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x118343;
      sprintf(pcVar9,"key%d",pcVar14);
      pfStack_b40 = (fdb_kvs_handle *)0x118357;
      sprintf(auStack_ac8,"body%d_txn2",pcVar14);
      pfVar7 = pfStack_b18;
      pfStack_b40 = (fdb_kvs_handle *)0x118364;
      sVar3 = strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x118378;
      fVar2 = fdb_get_kv(pfVar7,pcVar9,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar12 = pfStack_b30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011861a;
      pfStack_b40 = (fdb_kvs_handle *)0x118395;
      iVar6 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar6 != 0) goto LAB_0011860d;
      pfStack_b40 = (fdb_kvs_handle *)0x1183a5;
      fdb_free_block(pfVar12);
      uVar8 = (int)pcVar14 + 1;
      pcVar14 = (char *)(ulong)uVar8;
    } while (uVar8 != 10);
    pfStack_b40 = (fdb_kvs_handle *)0x1183be;
    fdb_end_transaction((fdb_file_handle *)phStack_b00,'\0');
    pcVar9 = auStack_ac8 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_b30;
    doc_00 = (fdb_kvs_handle *)&p_Stack_b28;
    pcVar14 = (char *)0x0;
    do {
      pfStack_b40 = (fdb_kvs_handle *)0x1183ec;
      sprintf(pcVar9,"key%d",pcVar14);
      pfStack_b40 = (fdb_kvs_handle *)0x118400;
      sprintf(auStack_ac8,"body%d_txn1",pcVar14);
      pfVar12 = pfStack_b20;
      pfStack_b40 = (fdb_kvs_handle *)0x11840d;
      sVar3 = strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x118421;
      fVar2 = fdb_get_kv(pfVar12,pcVar9,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar7 = pfStack_b30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011862c;
      pfStack_b40 = (fdb_kvs_handle *)0x11843e;
      iVar6 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar6 != 0) goto LAB_0011861f;
      pfStack_b40 = (fdb_kvs_handle *)0x11844e;
      fVar2 = fdb_free_block(pfVar7);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118631;
      pfStack_b40 = (fdb_kvs_handle *)0x11846a;
      sprintf(pcVar9,"key%d",pcVar14);
      pfStack_b40 = (fdb_kvs_handle *)0x11847e;
      sprintf(auStack_ac8,"body%d_txn2",pcVar14);
      pfVar7 = pfStack_b18;
      pfStack_b40 = (fdb_kvs_handle *)0x11848b;
      sVar3 = strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x11849f;
      fVar2 = fdb_get_kv(pfVar7,pcVar9,sVar3,(void **)handle,(size_t *)doc_00);
      pfVar11 = pfStack_b30;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00118636;
      pfStack_b40 = (fdb_kvs_handle *)0x1184bc;
      iVar6 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar6 != 0) goto LAB_0011863b;
      pfStack_b40 = (fdb_kvs_handle *)0x1184cc;
      fdb_free_block(pfVar11);
      uVar8 = (int)pcVar14 + 1;
      pcVar14 = (char *)(ulong)uVar8;
    } while (uVar8 != 10);
    pfStack_b40 = (fdb_kvs_handle *)0x1184e5;
    fdb_end_transaction((fdb_file_handle *)pkStack_b08,'\0');
    pcVar9 = auStack_ac8 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_b30;
    doc_00 = (fdb_kvs_handle *)&p_Stack_b28;
    pfVar11 = (fdb_kvs_handle *)0x0;
    while( true ) {
      pfStack_b40 = (fdb_kvs_handle *)0x118511;
      sprintf(pcVar9,"key%d",pfVar11);
      pfStack_b40 = (fdb_kvs_handle *)0x118524;
      sprintf(auStack_ac8,"body%d_txn2",pfVar11);
      pfVar12 = pfStack_b20;
      pfStack_b40 = (fdb_kvs_handle *)0x118531;
      sVar3 = strlen(pcVar9);
      pfStack_b40 = (fdb_kvs_handle *)0x118545;
      pfVar7 = pfVar12;
      fVar2 = fdb_get_kv(pfVar12,pcVar9,sVar3,(void **)handle,(size_t *)doc_00);
      pcVar14 = (char *)pfStack_b30;
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      pfStack_b40 = (fdb_kvs_handle *)0x118562;
      iVar6 = bcmp(pfStack_b30,auStack_ac8,(size_t)p_Stack_b28);
      if (iVar6 != 0) goto LAB_00118648;
      pfStack_b40 = (fdb_kvs_handle *)0x118572;
      fdb_free_block(pcVar14);
      uVar8 = (int)pfVar11 + 1;
      pfVar11 = (fdb_kvs_handle *)(ulong)uVar8;
      if (uVar8 == 10) {
        pfStack_b40 = (fdb_kvs_handle *)0x118583;
        fdb_close((fdb_file_handle *)phStack_af8);
        pfStack_b40 = (fdb_kvs_handle *)0x11858d;
        fdb_close((fdb_file_handle *)phStack_b00);
        pfStack_b40 = (fdb_kvs_handle *)0x118597;
        fdb_close((fdb_file_handle *)pkStack_b08);
        pfStack_b40 = (fdb_kvs_handle *)0x11859c;
        fdb_shutdown();
        pfStack_b40 = (fdb_kvs_handle *)0x1185a1;
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (transaction_simple_api_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        pfStack_b40 = (fdb_kvs_handle *)0x1185d2;
        fprintf(_stderr,pcVar9,"transaction simple API test");
        return;
      }
    }
LAB_00118655:
    config_00 = (fdb_kvs_config *)(auStack_ac8 + 0x100);
    pcVar14 = auStack_ac8;
    pfStack_b40 = (fdb_kvs_handle *)0x11865a;
    transaction_simple_api_test();
  }
  pfStack_b40 = (fdb_kvs_handle *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_b68 = pfVar11;
  pfStack_b60 = (fdb_kvs_handle *)pcVar14;
  pfStack_b58 = handle;
  pfStack_b50 = config_00;
  pfStack_b48 = pfVar12;
  pfStack_b40 = doc_00;
  gettimeofday(&tStack_d80,(__timezone_ptr_t)0x0);
  fVar2 = fdb_snapshot_open(pfVar7,&pfStack_d88,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_init(pfStack_d88,&pfStack_d98,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar13 = 0;
  do {
    uVar8 = (uint)uVar13;
    pfStack_d90 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_get(pfStack_d98,&pfStack_d90);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_c70,"key%d",uVar13);
    sprintf(acStack_d70,"body%d",uVar13);
    doc = pfStack_d90;
    pvVar1 = pfStack_d90->key;
    iVar6 = bcmp(pvVar1,acStack_c70,pfStack_d90->keylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_c70,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar1 = doc->body;
    iVar6 = bcmp(pvVar1,acStack_d70,doc->bodylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_d70,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar8 = uVar8 + 1;
    uVar13 = (ulong)uVar8;
    fdb_doc_free(doc);
    fVar2 = fdb_iterator_next(pfStack_d98);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  if (uVar8 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_close(pfStack_d98);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdcc,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_kvs_close(pfStack_d88);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  pthread_exit((void *)0x0);
}

Assistant:

void rollback_ncommits()
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, j, n=100;
    int ncommits=10;
    char keybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_status status;
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &kv2, NULL, &kvs_config);


    for(j=0;j<ncommits;++j){

        // set n docs per commit
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%02d%03d", j, i);
            fdb_set_kv(kv1, keybuf, strlen(keybuf), NULL, 0);
            fdb_set_kv(kv2, keybuf, strlen(keybuf), NULL, 0);
        }
        // alternate commit pattern
        if((j % 2) == 0){
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        } else {
            fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        }

        // doc_count should match seqnum since they are unique
        fdb_get_kvs_info(kv1, &info);
        TEST_CHK(info.doc_count == info.last_seqnum);
    }

    // iteratively rollback 5 commits
     for(j=ncommits;j>0;--j){
        status = fdb_rollback(&kv1, j*n);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // check rollback doc_count
        fdb_get_kvs_info(kv1, &info);
        TEST_CHK(info.doc_count == info.last_seqnum);
    }

    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("rollback n commits");
}